

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O3

void pd_defaultfloat(t_pd *x,t_float f)

{
  t_listmethod p_Var1;
  t_atom at;
  t_atom local_10;
  
  p_Var1 = (*x)->c_listmethod;
  local_10.a_w.w_float = f;
  if (p_Var1 == pd_defaultlist) {
    local_10.a_type = A_FLOAT;
    (*(*x)->c_anymethod)(x,&s_float,1,&local_10);
  }
  else {
    local_10.a_type = A_FLOAT;
    (*p_Var1)(x,(t_symbol *)0x0,1,&local_10);
  }
  return;
}

Assistant:

static void pd_defaultfloat(t_pd *x, t_float f)
{
    if (*(*x)->c_listmethod != pd_defaultlist)
    {
        t_atom at;
        SETFLOAT(&at, f);
        (*(*x)->c_listmethod)(x, 0, 1, &at);
    }
    else
    {
        t_atom at;
        SETFLOAT(&at, f);
        (*(*x)->c_anymethod)(x, &s_float, 1, &at);
    }
}